

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O2

void __thiscall
cmCacheManager::AddCacheEntry
          (cmCacheManager *this,string *key,cmValue value,cmValue helpString,CacheEntryType type)

{
  mapped_type *this_00;
  long lVar1;
  string *i;
  pointer path;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  allocator<char> local_6a;
  allocator<char> local_69;
  cmList paths;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
            ::operator[](&this->Cache,key);
  CacheEntry::SetValue(this_00,value);
  this_00->Type = type;
  if (type - PATH < 2) {
    lVar1 = std::__cxx11::string::find((char)this_00,0x3b);
    if (lVar1 == -1) {
      cmsys::SystemTools::ConvertToUnixSlashes(&this_00->Value);
    }
    else {
      std::__cxx11::string::string((string *)&local_48,(string *)this_00);
      init._M_len = 1;
      init._M_array = &local_48;
      cmList::cmList(&paths,init);
      std::__cxx11::string::~string((string *)&local_48);
      for (path = paths.Values.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
          path != paths.Values.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; path = path + 1) {
        cmsys::SystemTools::ConvertToUnixSlashes(path);
      }
      cmList::to_string_abi_cxx11_(&local_48,&paths);
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&paths.Values);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"HELPSTRING",&local_69);
  if (helpString.Value == (string *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&paths,"(This variable does not exist and should not be used)",&local_6a);
  }
  else {
    std::__cxx11::string::string((string *)&paths,(string *)helpString.Value);
  }
  CacheEntry::SetProperty(this_00,&local_48,(string *)&paths);
  std::__cxx11::string::~string((string *)&paths);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void cmCacheManager::AddCacheEntry(const std::string& key, cmValue value,
                                   cmValue helpString,
                                   cmStateEnums::CacheEntryType type)
{
  CacheEntry& e = this->Cache[key];
  e.SetValue(value);
  e.Type = type;
  // make sure we only use unix style paths
  if (type == cmStateEnums::FILEPATH || type == cmStateEnums::PATH) {
    if (e.Value.find(';') != std::string::npos) {
      cmList paths{ e.Value };
      for (std::string& i : paths) {
        cmSystemTools::ConvertToUnixSlashes(i);
      }
      e.Value = paths.to_string();
    } else {
      cmSystemTools::ConvertToUnixSlashes(e.Value);
    }
  }
  e.SetProperty(
    "HELPSTRING",
    helpString ? *helpString
               : std::string{
                   "(This variable does not exist and should not be used)" });
}